

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quest.cpp
# Opt level: O0

bool __thiscall Quest_Context::CheckRule(Quest_Context *this,Expression *expr)

{
  Gender GVar1;
  byte bVar2;
  Skin SVar3;
  Character *pCVar4;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_00;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_01;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_02;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_03;
  bool bVar5;
  short sVar6;
  uint uVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  const_iterator __first;
  const_iterator __last;
  int *piVar11;
  iterator pvVar12;
  mapped_type *pmVar13;
  size_type sVar14;
  const_reference pvVar15;
  string *local_b10;
  string *local_a68;
  string *local_9f0;
  string *local_978;
  string *local_900;
  bool local_8b5;
  bool local_7fb;
  bool local_7fa;
  int local_7e4;
  int local_7c4;
  bool local_795;
  bool local_769;
  string local_6b0;
  stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_690;
  string local_640;
  stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_620;
  allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_5cd;
  undefined1 local_5cc;
  allocator<char> local_5cb;
  allocator<char> local_5ca;
  allocator<char> local_5c9;
  string *local_5c8;
  string local_5c0;
  string local_5a0;
  string local_580 [32];
  string local_560;
  string local_540;
  string local_520 [32];
  string local_500 [32];
  iterator local_4e0;
  size_type local_4d8;
  deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_4d0;
  allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_47b;
  undefined1 local_47a;
  allocator<char> local_479;
  string *local_478;
  string local_470;
  string local_450;
  string local_430 [32];
  iterator local_410;
  size_type local_408;
  deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_400;
  allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_3ab;
  undefined1 local_3aa;
  allocator<char> local_3a9;
  string *local_3a8;
  string local_3a0;
  string local_380;
  string local_360 [32];
  iterator local_340;
  size_type local_338;
  deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_330;
  allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_2db;
  undefined1 local_2da;
  allocator<char> local_2d9;
  string *local_2d8;
  string local_2d0;
  string local_2b0;
  string local_290 [32];
  iterator local_270;
  size_type local_268;
  deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_260;
  allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_20b;
  undefined1 local_20a;
  allocator<char> local_209;
  string *local_208;
  string local_200;
  string local_1e0;
  string local_1c0 [32];
  iterator local_1a0;
  size_type local_198;
  deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_190;
  allocator<char> local_139;
  key_type local_138;
  int local_114;
  undefined1 local_110 [4];
  int roll;
  int local_f0;
  allocator<char> local_e9;
  key_type local_e8;
  allocator<char> local_c1;
  key_type local_c0;
  allocator<char> local_99;
  key_type local_98;
  allocator<char> local_71;
  key_type local_70;
  undefined4 local_50;
  undefined1 local_40 [8];
  string function_name;
  Expression *expr_local;
  Quest_Context *this_local;
  
  function_name.field_2._8_8_ = expr;
  bVar5 = Quest::Disabled(this->quest);
  if (bVar5) {
    this_local._7_1_ = false;
  }
  else {
    std::__cxx11::string::string((string *)local_40,(string *)(function_name.field_2._8_8_ + 0x50));
    bVar5 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            local_40,"always");
    if (bVar5) {
      this_local._7_1_ = true;
    }
    else {
      bVar5 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              local_40,"donedaily");
      if (bVar5) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_70,"d",&local_71);
        pmVar13 = std::
                  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_short,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_short>_>_>
                  ::operator[](&this->progress,&local_70);
        sVar6 = *pmVar13;
        iVar10 = quest_day();
        std::__cxx11::string::~string((string *)&local_70);
        std::allocator<char>::~allocator(&local_71);
        if (sVar6 == iVar10) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>((string *)&local_98,"c",&local_99);
          pmVar13 = std::
                    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_short,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_short>_>_>
                    ::operator[](&this->progress,&local_98);
          sVar6 = *pmVar13;
          pvVar15 = std::deque<util::variant,_std::allocator<util::variant>_>::operator[]
                              ((deque<util::variant,_std::allocator<util::variant>_> *)
                               (function_name.field_2._8_8_ + 0x70),0);
          iVar10 = util::variant::operator_cast_to_int(pvVar15);
          this_local._7_1_ = iVar10 <= sVar6;
          std::__cxx11::string::~string((string *)&local_98);
          std::allocator<char>::~allocator(&local_99);
        }
        else {
          iVar10 = quest_day();
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>((string *)&local_c0,"d",&local_c1);
          pmVar13 = std::
                    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_short,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_short>_>_>
                    ::operator[](&this->progress,&local_c0);
          *pmVar13 = (mapped_type)iVar10;
          std::__cxx11::string::~string((string *)&local_c0);
          std::allocator<char>::~allocator(&local_c1);
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>((string *)&local_e8,"c",&local_e9);
          pmVar13 = std::
                    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_short,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_short>_>_>
                    ::operator[](&this->progress,&local_e8);
          *pmVar13 = 0;
          std::__cxx11::string::~string((string *)&local_e8);
          std::allocator<char>::~allocator(&local_e9);
          this_local._7_1_ = false;
        }
      }
      else {
        bVar5 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )local_40,"entermap");
        if (bVar5) {
          sVar6 = this->character->map->id;
          pvVar15 = std::deque<util::variant,_std::allocator<util::variant>_>::operator[]
                              ((deque<util::variant,_std::allocator<util::variant>_> *)
                               (function_name.field_2._8_8_ + 0x70),0);
          iVar10 = util::variant::operator_cast_to_int(pvVar15);
          this_local._7_1_ = sVar6 == iVar10;
        }
        else {
          bVar5 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)local_40,"entercoord");
          if (bVar5) {
            sVar6 = this->character->map->id;
            pvVar15 = std::deque<util::variant,_std::allocator<util::variant>_>::operator[]
                                ((deque<util::variant,_std::allocator<util::variant>_> *)
                                 (function_name.field_2._8_8_ + 0x70),0);
            iVar10 = util::variant::operator_cast_to_int(pvVar15);
            local_769 = false;
            if (sVar6 == iVar10) {
              bVar2 = this->character->x;
              pvVar15 = std::deque<util::variant,_std::allocator<util::variant>_>::operator[]
                                  ((deque<util::variant,_std::allocator<util::variant>_> *)
                                   (function_name.field_2._8_8_ + 0x70),1);
              uVar7 = util::variant::operator_cast_to_int(pvVar15);
              local_769 = false;
              if (bVar2 == uVar7) {
                bVar2 = this->character->y;
                pvVar15 = std::deque<util::variant,_std::allocator<util::variant>_>::operator[]
                                    ((deque<util::variant,_std::allocator<util::variant>_> *)
                                     (function_name.field_2._8_8_ + 0x70),2);
                uVar7 = util::variant::operator_cast_to_int(pvVar15);
                local_769 = bVar2 == uVar7;
              }
            }
            this_local._7_1_ = local_769;
          }
          else {
            bVar5 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)local_40,"leavemap");
            if (bVar5) {
              sVar6 = this->character->map->id;
              pvVar15 = std::deque<util::variant,_std::allocator<util::variant>_>::operator[]
                                  ((deque<util::variant,_std::allocator<util::variant>_> *)
                                   (function_name.field_2._8_8_ + 0x70),0);
              iVar10 = util::variant::operator_cast_to_int(pvVar15);
              this_local._7_1_ = sVar6 != iVar10;
            }
            else {
              bVar5 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)local_40,"leavecoord");
              if (bVar5) {
                sVar6 = this->character->map->id;
                pvVar15 = std::deque<util::variant,_std::allocator<util::variant>_>::operator[]
                                    ((deque<util::variant,_std::allocator<util::variant>_> *)
                                     (function_name.field_2._8_8_ + 0x70),0);
                iVar10 = util::variant::operator_cast_to_int(pvVar15);
                local_795 = true;
                if (sVar6 == iVar10) {
                  bVar2 = this->character->x;
                  pvVar15 = std::deque<util::variant,_std::allocator<util::variant>_>::operator[]
                                      ((deque<util::variant,_std::allocator<util::variant>_> *)
                                       (function_name.field_2._8_8_ + 0x70),1);
                  uVar7 = util::variant::operator_cast_to_int(pvVar15);
                  local_795 = true;
                  if (bVar2 == uVar7) {
                    bVar2 = this->character->y;
                    pvVar15 = std::deque<util::variant,_std::allocator<util::variant>_>::operator[]
                                        ((deque<util::variant,_std::allocator<util::variant>_> *)
                                         (function_name.field_2._8_8_ + 0x70),2);
                    uVar7 = util::variant::operator_cast_to_int(pvVar15);
                    local_795 = bVar2 != uVar7;
                  }
                }
                this_local._7_1_ = local_795;
              }
              else {
                bVar5 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                         *)local_40,"gotitems");
                if (bVar5) {
                  pCVar4 = this->character;
                  pvVar15 = std::deque<util::variant,_std::allocator<util::variant>_>::operator[]
                                      ((deque<util::variant,_std::allocator<util::variant>_> *)
                                       (function_name.field_2._8_8_ + 0x70),0);
                  iVar10 = util::variant::operator_cast_to_int(pvVar15);
                  iVar10 = Character::HasItem(pCVar4,(short)iVar10,false);
                  sVar14 = std::deque<util::variant,_std::allocator<util::variant>_>::size
                                     ((deque<util::variant,_std::allocator<util::variant>_> *)
                                      (function_name.field_2._8_8_ + 0x70));
                  if (sVar14 < 2) {
                    local_7c4 = 1;
                  }
                  else {
                    pvVar15 = std::deque<util::variant,_std::allocator<util::variant>_>::operator[]
                                        ((deque<util::variant,_std::allocator<util::variant>_> *)
                                         (function_name.field_2._8_8_ + 0x70),1);
                    local_7c4 = util::variant::operator_cast_to_int(pvVar15);
                  }
                  this_local._7_1_ = local_7c4 <= iVar10;
                }
                else {
                  bVar5 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                           *)local_40,"lostitems");
                  if (bVar5) {
                    pCVar4 = this->character;
                    pvVar15 = std::deque<util::variant,_std::allocator<util::variant>_>::operator[]
                                        ((deque<util::variant,_std::allocator<util::variant>_> *)
                                         (function_name.field_2._8_8_ + 0x70),0);
                    iVar10 = util::variant::operator_cast_to_int(pvVar15);
                    iVar10 = Character::HasItem(pCVar4,(short)iVar10,false);
                    sVar14 = std::deque<util::variant,_std::allocator<util::variant>_>::size
                                       ((deque<util::variant,_std::allocator<util::variant>_> *)
                                        (function_name.field_2._8_8_ + 0x70));
                    if (sVar14 < 2) {
                      local_7e4 = 1;
                    }
                    else {
                      pvVar15 = std::deque<util::variant,_std::allocator<util::variant>_>::
                                operator[]((deque<util::variant,_std::allocator<util::variant>_> *)
                                           (function_name.field_2._8_8_ + 0x70),1);
                      local_7e4 = util::variant::operator_cast_to_int(pvVar15);
                    }
                    this_local._7_1_ = iVar10 < local_7e4;
                  }
                  else {
                    bVar5 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                             *)local_40,"gotspell");
                    if (bVar5) {
                      pCVar4 = this->character;
                      pvVar15 = std::deque<util::variant,_std::allocator<util::variant>_>::
                                operator[]((deque<util::variant,_std::allocator<util::variant>_> *)
                                           (function_name.field_2._8_8_ + 0x70),0);
                      iVar10 = util::variant::operator_cast_to_int(pvVar15);
                      bVar5 = Character::HasSpell(pCVar4,(short)iVar10);
                      local_7fa = false;
                      if (bVar5) {
                        sVar14 = std::deque<util::variant,_std::allocator<util::variant>_>::size
                                           ((deque<util::variant,_std::allocator<util::variant>_> *)
                                            (function_name.field_2._8_8_ + 0x70));
                        local_7fb = true;
                        if (1 < sVar14) {
                          pCVar4 = this->character;
                          pvVar15 = std::deque<util::variant,_std::allocator<util::variant>_>::
                                    operator[]((deque<util::variant,_std::allocator<util::variant>_>
                                                *)(function_name.field_2._8_8_ + 0x70),0);
                          iVar10 = util::variant::operator_cast_to_int(pvVar15);
                          sVar6 = Character::SpellLevel(pCVar4,(short)iVar10);
                          pvVar15 = std::deque<util::variant,_std::allocator<util::variant>_>::
                                    operator[]((deque<util::variant,_std::allocator<util::variant>_>
                                                *)(function_name.field_2._8_8_ + 0x70),1);
                          iVar10 = util::variant::operator_cast_to_int(pvVar15);
                          local_7fb = iVar10 <= sVar6;
                        }
                        local_7fa = local_7fb;
                      }
                      this_local._7_1_ = local_7fa;
                    }
                    else {
                      bVar5 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                               *)local_40,"lostspell");
                      if (bVar5) {
                        pCVar4 = this->character;
                        pvVar15 = std::deque<util::variant,_std::allocator<util::variant>_>::
                                  operator[]((deque<util::variant,_std::allocator<util::variant>_> *
                                             )(function_name.field_2._8_8_ + 0x70),0);
                        iVar10 = util::variant::operator_cast_to_int(pvVar15);
                        bVar5 = Character::HasSpell(pCVar4,(short)iVar10);
                        this_local._7_1_ = (bool)((bVar5 ^ 0xffU) & 1);
                      }
                      else {
                        bVar5 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                 *)local_40,"isgender");
                        if (bVar5) {
                          GVar1 = this->character->gender;
                          pvVar15 = std::deque<util::variant,_std::allocator<util::variant>_>::
                                    operator[]((deque<util::variant,_std::allocator<util::variant>_>
                                                *)(function_name.field_2._8_8_ + 0x70),0);
                          uVar7 = util::variant::operator_cast_to_int(pvVar15);
                          this_local._7_1_ = (uint)GVar1 == (uVar7 & 0xff);
                        }
                        else {
                          bVar5 = std::operator==((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)local_40,"isclass");
                          if (bVar5) {
                            bVar2 = this->character->clas;
                            pvVar15 = std::deque<util::variant,_std::allocator<util::variant>_>::
                                      operator[]((deque<util::variant,_std::allocator<util::variant>_>
                                                  *)(function_name.field_2._8_8_ + 0x70),0);
                            uVar7 = util::variant::operator_cast_to_int(pvVar15);
                            this_local._7_1_ = bVar2 == uVar7;
                          }
                          else {
                            bVar5 = std::operator==((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)local_40,"israce");
                            if (bVar5) {
                              SVar3 = this->character->race;
                              pvVar15 = std::deque<util::variant,_std::allocator<util::variant>_>::
                                        operator[]((
                                                  deque<util::variant,_std::allocator<util::variant>_>
                                                  *)(function_name.field_2._8_8_ + 0x70),0);
                              uVar7 = util::variant::operator_cast_to_int(pvVar15);
                              this_local._7_1_ = SVar3 == uVar7;
                            }
                            else {
                              bVar5 = std::operator==((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)local_40,"iswearing");
                              if (bVar5) {
                                __first = std::cbegin<std::array<int,15ul>>
                                                    (&this->character->paperdoll);
                                __last = std::cend<std::array<int,15ul>>
                                                   (&this->character->paperdoll);
                                pvVar15 = std::deque<util::variant,_std::allocator<util::variant>_>
                                          ::operator[]((
                                                  deque<util::variant,_std::allocator<util::variant>_>
                                                  *)(function_name.field_2._8_8_ + 0x70),0);
                                local_f0 = util::variant::operator_cast_to_int(pvVar15);
                                piVar11 = std::find<int_const*,int>(__first,__last,&local_f0);
                                pvVar12 = std::array<int,_15UL>::end(&this->character->paperdoll);
                                this_local._7_1_ = piVar11 != pvVar12;
                              }
                              else {
                                bVar5 = std::operator==((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)local_40,"citizenof");
                                if (bVar5) {
                                  pCVar4 = this->character;
                                  pvVar15 = std::
                                            deque<util::variant,_std::allocator<util::variant>_>::
                                            operator[]((
                                                  deque<util::variant,_std::allocator<util::variant>_>
                                                  *)(function_name.field_2._8_8_ + 0x70),0);
                                  util::variant::operator_cast_to_string
                                            ((string *)local_110,pvVar15);
                                  this_local._7_1_ =
                                       std::operator==(&pCVar4->home,
                                                       (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)local_110);
                                  std::__cxx11::string::~string((string *)local_110);
                                }
                                else {
                                  bVar5 = std::operator==((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)local_40,"rolled");
                                  if (bVar5) {
                                    std::allocator<char>::allocator();
                                    std::__cxx11::string::string<std::allocator<char>>
                                              ((string *)&local_138,"r",&local_139);
                                    pmVar13 = std::
                                              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_short,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_short>_>_>
                                              ::operator[](&this->progress,&local_138);
                                    sVar6 = *pmVar13;
                                    std::__cxx11::string::~string((string *)&local_138);
                                    std::allocator<char>::~allocator(&local_139);
                                    local_114 = (int)sVar6;
                                    sVar14 = std::
                                             deque<util::variant,_std::allocator<util::variant>_>::
                                             size((
                                                  deque<util::variant,_std::allocator<util::variant>_>
                                                  *)(function_name.field_2._8_8_ + 0x70));
                                    iVar10 = local_114;
                                    if (sVar14 < 2) {
                                      pvVar15 = std::
                                                deque<util::variant,_std::allocator<util::variant>_>
                                                ::operator[]((
                                                  deque<util::variant,_std::allocator<util::variant>_>
                                                  *)(function_name.field_2._8_8_ + 0x70),0);
                                      iVar8 = util::variant::operator_cast_to_int(pvVar15);
                                      this_local._7_1_ = iVar10 == iVar8;
                                    }
                                    else {
                                      pvVar15 = std::
                                                deque<util::variant,_std::allocator<util::variant>_>
                                                ::operator[]((
                                                  deque<util::variant,_std::allocator<util::variant>_>
                                                  *)(function_name.field_2._8_8_ + 0x70),0);
                                      iVar9 = util::variant::operator_cast_to_int(pvVar15);
                                      iVar8 = local_114;
                                      local_8b5 = false;
                                      if (iVar9 <= iVar10) {
                                        pvVar15 = std::
                                                  deque<util::variant,_std::allocator<util::variant>_>
                                                  ::operator[]((
                                                  deque<util::variant,_std::allocator<util::variant>_>
                                                  *)(function_name.field_2._8_8_ + 0x70),1);
                                        iVar10 = util::variant::operator_cast_to_int(pvVar15);
                                        local_8b5 = iVar8 <= iVar10;
                                      }
                                      this_local._7_1_ = local_8b5;
                                    }
                                  }
                                  else {
                                    bVar5 = std::operator==((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)local_40,"statis");
                                    if (bVar5) {
                                      local_20a = 1;
                                      local_208 = &local_200;
                                      pvVar15 = std::
                                                deque<util::variant,_std::allocator<util::variant>_>
                                                ::operator[]((
                                                  deque<util::variant,_std::allocator<util::variant>_>
                                                  *)(function_name.field_2._8_8_ + 0x70),1);
                                      util::variant::operator_cast_to_string(&local_200,pvVar15);
                                      local_208 = &local_1e0;
                                      pvVar15 = std::
                                                deque<util::variant,_std::allocator<util::variant>_>
                                                ::operator[]((
                                                  deque<util::variant,_std::allocator<util::variant>_>
                                                  *)(function_name.field_2._8_8_ + 0x70),0);
                                      util::variant::operator_cast_to_string(&local_1e0,pvVar15);
                                      local_208 = (string *)local_1c0;
                                      std::allocator<char>::allocator();
                                      std::__cxx11::string::string<std::allocator<char>>
                                                (local_1c0,"=",&local_209);
                                      local_20a = 0;
                                      local_1a0 = &local_200;
                                      local_198 = 3;
                                      std::
                                      allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                      ::allocator(&local_20b);
                                      __l_03._M_len = local_198;
                                      __l_03._M_array = local_1a0;
                                      std::
                                      deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      ::deque(&local_190,__l_03,&local_20b);
                                      this_local._7_1_ = rpn_char_eval(&local_190,this->character);
                                      std::
                                      deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      ::~deque(&local_190);
                                      std::
                                      allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                      ::~allocator(&local_20b);
                                      local_900 = (string *)&local_1a0;
                                      do {
                                        local_900 = local_900 + -1;
                                        std::__cxx11::string::~string((string *)local_900);
                                      } while (local_900 != &local_200);
                                      std::allocator<char>::~allocator(&local_209);
                                    }
                                    else {
                                      bVar5 = std::operator==((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)local_40,"statnot");
                                      if (bVar5) {
                                        local_2da = 1;
                                        local_2d8 = &local_2d0;
                                        pvVar15 = std::
                                                  deque<util::variant,_std::allocator<util::variant>_>
                                                  ::operator[]((
                                                  deque<util::variant,_std::allocator<util::variant>_>
                                                  *)(function_name.field_2._8_8_ + 0x70),1);
                                        util::variant::operator_cast_to_string(&local_2d0,pvVar15);
                                        local_2d8 = &local_2b0;
                                        pvVar15 = std::
                                                  deque<util::variant,_std::allocator<util::variant>_>
                                                  ::operator[]((
                                                  deque<util::variant,_std::allocator<util::variant>_>
                                                  *)(function_name.field_2._8_8_ + 0x70),0);
                                        util::variant::operator_cast_to_string(&local_2b0,pvVar15);
                                        local_2d8 = (string *)local_290;
                                        std::allocator<char>::allocator();
                                        std::__cxx11::string::string<std::allocator<char>>
                                                  (local_290,"=",&local_2d9);
                                        local_2da = 0;
                                        local_270 = &local_2d0;
                                        local_268 = 3;
                                        std::
                                        allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                        ::allocator(&local_2db);
                                        __l_02._M_len = local_268;
                                        __l_02._M_array = local_270;
                                        std::
                                        deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        ::deque(&local_260,__l_02,&local_2db);
                                        this_local._7_1_ = rpn_char_eval(&local_260,this->character)
                                        ;
                                        std::
                                        deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        ::~deque(&local_260);
                                        std::
                                        allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                        ::~allocator(&local_2db);
                                        local_978 = (string *)&local_270;
                                        do {
                                          local_978 = local_978 + -1;
                                          std::__cxx11::string::~string((string *)local_978);
                                        } while (local_978 != &local_2d0);
                                        std::allocator<char>::~allocator(&local_2d9);
                                      }
                                      else {
                                        bVar5 = std::operator==((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)local_40,"statgreater");
                                        if (bVar5) {
                                          local_3aa = 1;
                                          local_3a8 = &local_3a0;
                                          pvVar15 = std::
                                                  deque<util::variant,_std::allocator<util::variant>_>
                                                  ::operator[]((
                                                  deque<util::variant,_std::allocator<util::variant>_>
                                                  *)(function_name.field_2._8_8_ + 0x70),1);
                                          util::variant::operator_cast_to_string(&local_3a0,pvVar15)
                                          ;
                                          local_3a8 = &local_380;
                                          pvVar15 = std::
                                                  deque<util::variant,_std::allocator<util::variant>_>
                                                  ::operator[]((
                                                  deque<util::variant,_std::allocator<util::variant>_>
                                                  *)(function_name.field_2._8_8_ + 0x70),0);
                                          util::variant::operator_cast_to_string(&local_380,pvVar15)
                                          ;
                                          local_3a8 = (string *)local_360;
                                          std::allocator<char>::allocator();
                                          std::__cxx11::string::string<std::allocator<char>>
                                                    (local_360,">",&local_3a9);
                                          local_3aa = 0;
                                          local_340 = &local_3a0;
                                          local_338 = 3;
                                          std::
                                          allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                          ::allocator(&local_3ab);
                                          __l_01._M_len = local_338;
                                          __l_01._M_array = local_340;
                                          std::
                                          deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                          ::deque(&local_330,__l_01,&local_3ab);
                                          this_local._7_1_ =
                                               rpn_char_eval(&local_330,this->character);
                                          std::
                                          deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                          ::~deque(&local_330);
                                          std::
                                          allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                          ::~allocator(&local_3ab);
                                          local_9f0 = (string *)&local_340;
                                          do {
                                            local_9f0 = local_9f0 + -1;
                                            std::__cxx11::string::~string((string *)local_9f0);
                                          } while (local_9f0 != &local_3a0);
                                          std::allocator<char>::~allocator(&local_3a9);
                                        }
                                        else {
                                          bVar5 = std::operator==((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)local_40,"statless");
                                          if (bVar5) {
                                            local_47a = 1;
                                            local_478 = &local_470;
                                            pvVar15 = std::
                                                  deque<util::variant,_std::allocator<util::variant>_>
                                                  ::operator[]((
                                                  deque<util::variant,_std::allocator<util::variant>_>
                                                  *)(function_name.field_2._8_8_ + 0x70),1);
                                            util::variant::operator_cast_to_string
                                                      (&local_470,pvVar15);
                                            local_478 = &local_450;
                                            pvVar15 = std::
                                                  deque<util::variant,_std::allocator<util::variant>_>
                                                  ::operator[]((
                                                  deque<util::variant,_std::allocator<util::variant>_>
                                                  *)(function_name.field_2._8_8_ + 0x70),0);
                                            util::variant::operator_cast_to_string
                                                      (&local_450,pvVar15);
                                            local_478 = (string *)local_430;
                                            std::allocator<char>::allocator();
                                            std::__cxx11::string::string<std::allocator<char>>
                                                      (local_430,"<",&local_479);
                                            local_47a = 0;
                                            local_410 = &local_470;
                                            local_408 = 3;
                                            std::
                                            allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                            ::allocator(&local_47b);
                                            __l_00._M_len = local_408;
                                            __l_00._M_array = local_410;
                                            std::
                                            deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                            ::deque(&local_400,__l_00,&local_47b);
                                            this_local._7_1_ =
                                                 rpn_char_eval(&local_400,this->character);
                                            std::
                                            deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                            ::~deque(&local_400);
                                            std::
                                            allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                            ::~allocator(&local_47b);
                                            local_a68 = (string *)&local_410;
                                            do {
                                              local_a68 = local_a68 + -1;
                                              std::__cxx11::string::~string((string *)local_a68);
                                            } while (local_a68 != &local_470);
                                            std::allocator<char>::~allocator(&local_479);
                                          }
                                          else {
                                            bVar5 = std::operator==((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)local_40,"statbetween");
                                            if (bVar5) {
                                              local_5cc = 1;
                                              local_5c8 = &local_5c0;
                                              pvVar15 = std::
                                                  deque<util::variant,_std::allocator<util::variant>_>
                                                  ::operator[]((
                                                  deque<util::variant,_std::allocator<util::variant>_>
                                                  *)(function_name.field_2._8_8_ + 0x70),1);
                                              util::variant::operator_cast_to_string
                                                        (&local_5c0,pvVar15);
                                              local_5c8 = &local_5a0;
                                              pvVar15 = std::
                                                  deque<util::variant,_std::allocator<util::variant>_>
                                                  ::operator[]((
                                                  deque<util::variant,_std::allocator<util::variant>_>
                                                  *)(function_name.field_2._8_8_ + 0x70),0);
                                              util::variant::operator_cast_to_string
                                                        (&local_5a0,pvVar15);
                                              local_5c8 = (string *)local_580;
                                              std::allocator<char>::allocator();
                                              std::__cxx11::string::string<std::allocator<char>>
                                                        (local_580,"gte",&local_5c9);
                                              local_5c8 = &local_560;
                                              pvVar15 = std::
                                                  deque<util::variant,_std::allocator<util::variant>_>
                                                  ::operator[]((
                                                  deque<util::variant,_std::allocator<util::variant>_>
                                                  *)(function_name.field_2._8_8_ + 0x70),2);
                                              util::variant::operator_cast_to_string
                                                        (&local_560,pvVar15);
                                              local_5c8 = &local_540;
                                              pvVar15 = std::
                                                  deque<util::variant,_std::allocator<util::variant>_>
                                                  ::operator[]((
                                                  deque<util::variant,_std::allocator<util::variant>_>
                                                  *)(function_name.field_2._8_8_ + 0x70),0);
                                              util::variant::operator_cast_to_string
                                                        (&local_540,pvVar15);
                                              local_5c8 = (string *)local_520;
                                              std::allocator<char>::allocator();
                                              std::__cxx11::string::string<std::allocator<char>>
                                                        (local_520,"lte",&local_5ca);
                                              local_5c8 = (string *)local_500;
                                              std::allocator<char>::allocator();
                                              std::__cxx11::string::string<std::allocator<char>>
                                                        (local_500,"and",&local_5cb);
                                              local_5cc = 0;
                                              local_4e0 = &local_5c0;
                                              local_4d8 = 7;
                                              std::
                                              allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                              ::allocator(&local_5cd);
                                              __l._M_len = local_4d8;
                                              __l._M_array = local_4e0;
                                              std::
                                              deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                              ::deque(&local_4d0,__l,&local_5cd);
                                              this_local._7_1_ =
                                                   rpn_char_eval(&local_4d0,this->character);
                                              std::
                                              deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                              ::~deque(&local_4d0);
                                              std::
                                              allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                              ::~allocator(&local_5cd);
                                              local_b10 = (string *)&local_4e0;
                                              do {
                                                local_b10 = local_b10 + -1;
                                                std::__cxx11::string::~string((string *)local_b10);
                                              } while (local_b10 != &local_5c0);
                                              std::allocator<char>::~allocator(&local_5cb);
                                              std::allocator<char>::~allocator(&local_5ca);
                                              std::allocator<char>::~allocator(&local_5c9);
                                            }
                                            else {
                                              bVar5 = std::operator==((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)local_40,"statrpn");
                                              if (bVar5) {
                                                pvVar15 = std::
                                                  deque<util::variant,_std::allocator<util::variant>_>
                                                  ::operator[]((
                                                  deque<util::variant,_std::allocator<util::variant>_>
                                                  *)(function_name.field_2._8_8_ + 0x70),0);
                                                util::variant::operator_cast_to_string
                                                          (&local_640,pvVar15);
                                                util::rpn_parse(&local_620,&local_640);
                                                this_local._7_1_ =
                                                     rpn_char_eval(&local_620,this->character);
                                                std::
                                                stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                                ::~stack(&local_620);
                                                std::__cxx11::string::~string((string *)&local_640);
                                              }
                                              else {
                                                bVar5 = std::operator==((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)local_40,"stateval");
                                                if (bVar5) {
                                                  pvVar15 = std::
                                                  deque<util::variant,_std::allocator<util::variant>_>
                                                  ::operator[]((
                                                  deque<util::variant,_std::allocator<util::variant>_>
                                                  *)(function_name.field_2._8_8_ + 0x70),0);
                                                  util::variant::operator_cast_to_string
                                                            (&local_6b0,pvVar15);
                                                  util::rpn_parse_v2(&local_690,&local_6b0);
                                                  this_local._7_1_ =
                                                       rpn_char_eval(&local_690,this->character);
                                                  std::
                                                  stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                                  ::~stack(&local_690);
                                                  std::__cxx11::string::~string
                                                            ((string *)&local_6b0);
                                                }
                                                else {
                                                  this_local._7_1_ = false;
                                                }
                                              }
                                            }
                                          }
                                        }
                                      }
                                    }
                                  }
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
    local_50 = 1;
    std::__cxx11::string::~string((string *)local_40);
  }
  return this_local._7_1_;
}

Assistant:

bool Quest_Context::CheckRule(const EOPlus::Expression& expr)
{
	if (this->quest->Disabled())
		return false;

	std::string function_name = expr.function;

	if (function_name == "always")
	{
		return true;
	}
	else if (function_name == "donedaily")
	{
		if (this->progress["d"] == quest_day())
		{
			return this->progress["c"] >= int(expr.args[0]);
		}
		else
		{
			this->progress["d"] = quest_day();
			this->progress["c"] = 0;
			return false;
		}
	}
	else if (function_name == "entermap")
	{
		return this->character->map->id == int(expr.args[0]);
	}
	else if (function_name == "entercoord")
	{
		return this->character->map->id == int(expr.args[0])
		    && this->character->x == int(expr.args[1])
		    && this->character->y == int(expr.args[2]);
	}
	else if (function_name == "leavemap")
	{
		return this->character->map->id != int(expr.args[0]);
	}
	else if (function_name == "leavecoord")
	{
		return this->character->map->id != int(expr.args[0])
		    || this->character->x != int(expr.args[1])
		    || this->character->y != int(expr.args[2]);
	}
	else if (function_name == "gotitems")
	{
		return this->character->HasItem(int(expr.args[0])) >= (expr.args.size() >= 2 ? int(expr.args[1]) : 1);
	}
	else if (function_name == "lostitems")
	{
		return this->character->HasItem(int(expr.args[0])) < (expr.args.size() >= 2 ? int(expr.args[1]) : 1);
	}
	else if (function_name == "gotspell")
	{
		return this->character->HasSpell(int(expr.args[0]))
		    && (expr.args.size() < 2 || this->character->SpellLevel(int(expr.args[0])) >= int(expr.args[1]));
	}
	else if (function_name == "lostspell")
	{
		return !this->character->HasSpell(int(expr.args[0]));
	}
	else if (function_name == "isgender")
	{
		return this->character->gender == Gender(int(expr.args[0]));
	}
	else if (function_name == "isclass")
	{
		return this->character->clas == int(expr.args[0]);
	}
	else if (function_name == "israce")
	{
		return this->character->race == int(expr.args[0]);
	}
	else if (function_name == "iswearing")
	{
		return std::find(UTIL_CRANGE(this->character->paperdoll), int(expr.args[0])) != this->character->paperdoll.end();
	}
	else if (function_name == "citizenof")
	{
		return this->character->home == std::string(expr.args[0]);
	}
	else if (function_name == "rolled")
	{
		int roll = this->progress["r"];

		if (expr.args.size() < 2)
		{
			return roll == int(expr.args[0]);
		}
		else
		{
			return roll >= int(expr.args[0])
			    && roll <= int(expr.args[1]);
		}
	}
	else if (function_name == "statis")
	{
		return rpn_char_eval({expr.args[1], expr.args[0], "="}, character);
	}
	else if (function_name == "statnot")
	{
		return rpn_char_eval({expr.args[1], expr.args[0], "="}, character);
	}
	else if (function_name == "statgreater")
	{
		return rpn_char_eval({expr.args[1], expr.args[0], ">"}, character);
	}
	else if (function_name == "statless")
	{
		return rpn_char_eval({expr.args[1], expr.args[0], "<"}, character);
	}
	else if (function_name == "statbetween")
	{
		return rpn_char_eval({expr.args[1], expr.args[0], "gte", expr.args[2], expr.args[0], "lte", "and"}, character);
	}
	else if (function_name == "statrpn")
	{
		return rpn_char_eval(util::rpn_parse(expr.args[0]), character);
	}
	else if (function_name == "stateval")
	{
		return rpn_char_eval(util::rpn_parse_v2(expr.args[0]), character);
	}

	return false;
}